

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double mass_phi1;
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmyy2;
  double Jmzz2;
  double mass_phi2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmyy1;
  double Jmzz1;
  ChMatrix33<double> RotsectB;
  ChMatrix33<double> RotsectA;
  ChMatrixNM<double,_12,_12> Tm;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_6,_6> Tm2;
  ChMatrixNM<double,_6,_6> Tm1;
  double local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined1 local_cd8 [8];
  undefined1 local_cd0 [8];
  undefined1 local_cc8 [8];
  double local_cc0;
  double local_cb8;
  double local_cb0;
  undefined1 local_ca8 [8];
  undefined1 local_ca0 [8];
  undefined1 local_c98 [8];
  double local_c90;
  double local_c88;
  undefined1 local_c80 [16];
  Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  *local_c70;
  variable_if_dynamic<long,__1> local_c68;
  variable_if_dynamic<long,__1> vStack_c60;
  Index local_c58;
  ChMatrix33<double> local_c50;
  ChMatrix33<double> local_c08;
  undefined1 local_bc0 [16];
  DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *local_bb0;
  variable_if_dynamic<long,__1> local_ba8;
  variable_if_dynamic<long,__1> vStack_ba0;
  Index local_b98;
  undefined1 auStack_950 [528];
  undefined1 local_740 [312];
  undefined1 local_608 [624];
  undefined1 local_398 [248];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined8 local_298;
  undefined8 local_278;
  undefined4 local_248;
  undefined4 uStack_244;
  Matrix<double,_6,_6,_1,_6,_6> local_1a0;
  
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)M);
  dVar21 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x58))();
  peVar4 = (this->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_cf0 = (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_ce8 = 0;
  local_d00 = (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_cf8 = 0;
  (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar4,&local_c90,&local_c88,local_c98,&local_d28,local_ca0,local_ca8);
  dVar22 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x58))();
  peVar4 = (this->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_d10 = (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_d08 = 0;
  local_d20 = (peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_d18 = 0;
  (**(code **)((long)(peVar4->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar4,&local_cc0,&local_cb8,local_cc8,&local_cb0,local_cd0,local_cd8);
  dVar23 = this->length;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar23;
  peVar5 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar2 = peVar5->phimy;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar2;
  dVar3 = peVar5->phimz;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3;
  dVar6 = dVar23 * dVar23;
  dVar7 = dVar2 * dVar2;
  dVar8 = dVar3 * dVar3;
  auVar11 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar39,ZEXT816(0x3fb999999999999a));
  auVar12 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar28,ZEXT816(0x3fb999999999999a));
  auVar13 = vfmadd213sd_avx512f(ZEXT816(0x3fc5555555555555),auVar39,ZEXT816(0x3fc1111111111111));
  auVar14 = vfmadd231sd_avx512f(ZEXT816(0x3fc1111111111111),auVar28,ZEXT816(0x3fc5555555555555));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8;
  auVar15 = vfmadd231sd_avx512f(auVar14,auVar18,ZEXT816(0x3fd5555555555555));
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar7;
  auVar16 = vfmadd231sd_avx512f(auVar13,auVar40,ZEXT816(0x3fd5555555555555));
  dVar9 = (0.0 / dVar23) * (0.0 / dVar23);
  dVar10 = (dVar2 + 1.0) * (dVar2 + 1.0);
  dVar3 = (dVar3 + 1.0) * (dVar3 + 1.0);
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar39,ZEXT816(0x3fd7c57c57c57c58));
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar28,ZEXT816(0x3fd7c57c57c57c58));
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar40,ZEXT816(0x3fd5555555555555));
  auVar14 = vfmadd231sd_avx512f(auVar14,auVar18,ZEXT816(0x3fd5555555555555));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar9;
  auVar13 = vfmadd231sd_fma(auVar13,auVar34,ZEXT816(0x3ff3333333333333));
  auVar14 = vfmadd231sd_fma(auVar14,auVar34,ZEXT816(0x3ff3333333333333));
  dVar26 = auVar14._0_8_ / dVar3;
  dVar25 = auVar13._0_8_ / dVar10;
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar39,ZEXT816(0x3fc0750750750750));
  auVar14 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar28,ZEXT816(0x3fc0750750750750));
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar7;
  auVar29 = ZEXT816(0x3fc5555555555555);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar41,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar8;
  auVar17 = vfmadd231sd_avx512f(auVar14,auVar30,auVar29);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar9;
  auVar14 = vfmadd231sd_fma(auVar13,auVar35,ZEXT816(0xbff3333333333333));
  auVar17 = vfmadd231sd_fma(auVar17,auVar35,ZEXT816(0xbff3333333333333));
  auVar18 = vfmadd213sd_avx512f(ZEXT816(0x3fb7777777777777),auVar28,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3fb7777777777777),auVar39,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar30,ZEXT816(0x3fa5555555555555));
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar41,ZEXT816(0x3fa5555555555555));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar12,auVar35);
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar11,auVar35);
  auVar18 = vmulsd_avx512f(auVar24,auVar18);
  auVar19 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar39,ZEXT816(0x3f9fb1fb1fb1fb20));
  auVar20 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar28,ZEXT816(0x3f9fb1fb1fb1fb20));
  dVar33 = auVar18._0_8_ / dVar3;
  dVar27 = (dVar23 * auVar13._0_8_) / dVar10;
  auVar13 = vfmadd231sd_avx512f(auVar19,auVar41,ZEXT816(0x3fa5555555555555));
  auVar18 = vfmadd231sd_avx512f(auVar20,auVar30,ZEXT816(0x3fa5555555555555));
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar9;
  auVar13 = vfnmadd231sd_avx512f(auVar13,auVar36,auVar11);
  auVar11 = vfnmadd231sd_avx512f(auVar18,auVar36,auVar12);
  auVar11 = vmulsd_avx512f(auVar24,auVar11);
  auVar13 = vmulsd_avx512f(auVar24,auVar13);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3;
  auVar11 = vdivsd_avx512f(auVar11,auVar38);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar10;
  auVar12 = vdivsd_avx512f(auVar13,auVar43);
  auVar13 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar39,ZEXT816(0x3f83813813813814));
  auVar18 = vfmadd231sd_avx512f(ZEXT816(0x3f83813813813814),auVar28,ZEXT816(0x3f91111111111111));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar30,ZEXT816(0x3f81111111111111));
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar41,ZEXT816(0x3f81111111111111));
  auVar15 = vfmadd213sd_avx512f(auVar15,auVar36,auVar18);
  auVar13 = vfmadd213sd_avx512f(auVar16,auVar36,auVar13);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar15 = vmulsd_avx512f(auVar16,auVar15);
  auVar13 = vmulsd_avx512f(auVar16,auVar13);
  auVar15 = vdivsd_avx512f(auVar15,auVar38);
  auVar16 = vdivsd_avx512f(auVar13,auVar43);
  auVar13 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar39,ZEXT816(0x3f7d41d41d41d41d));
  auVar18 = vfmadd213sd_avx512f(auVar39,auVar29,ZEXT816(0x3fa1111111111111));
  auVar19 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar28,ZEXT816(0x3f7d41d41d41d41d));
  auVar20 = vfmadd213sd_avx512f(auVar29,auVar28,ZEXT816(0x3fa1111111111111));
  dVar21 = dVar23 * dVar21;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar7;
  auVar13 = vfmadd231sd_avx512f(auVar13,auVar42,ZEXT816(0x3f81111111111111));
  auVar18 = vfmadd231sd_avx512f(auVar18,ZEXT816(0xbfc5555555555555),auVar42);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar8;
  auVar19 = vfmadd231sd_avx512f(auVar19,auVar31,ZEXT816(0x3f81111111111111));
  auVar20 = vfmadd231sd_avx512f(auVar20,auVar31,ZEXT816(0xbfc5555555555555));
  dVar22 = dVar23 * dVar22;
  auVar18 = vfmadd213sd_avx512f(auVar18,auVar36,auVar13);
  auVar13 = vfmadd213sd_avx512f(auVar20,auVar36,auVar19);
  dVar7 = dVar23 * peVar5->mu;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6;
  auVar19 = vmulsd_avx512f(auVar19,auVar13);
  dVar2 = peVar5->Jmxx;
  dVar8 = dVar7 * (auVar14._0_8_ / dVar10);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       dVar21 / 3.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = dVar22 / 3.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar7;
  auVar13 = vdivsd_avx512f(auVar37,ZEXT816(0x4018000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x48;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 6;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_c90 + local_c88;
  auVar13 = vmulsd_avx512f(auVar24,auVar13);
  auVar13 = vdivsd_avx512f(auVar13,ZEXT816(0x4008000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x27;
  vmovsd_avx512f(auVar13);
  *pdVar1 = *pdVar1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = ((local_cc0 + local_cb8) * dVar23) / 3.0;
  dVar23 = (dVar23 * dVar2) / 6.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = dVar21 * dVar25;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = dVar21 * dVar26;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar21;
  auVar13 = vmulsd_avx512f(auVar29,auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar13._0_8_;
  auVar13 = vmulsd_avx512f(auVar29,auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = auVar13._0_8_;
  dVar23 = dVar7 * (auVar17._0_8_ / dVar3);
  auVar20._0_8_ = -dVar7;
  auVar20._8_8_ = 0x8000000000000000;
  auVar13 = vmulsd_avx512f(auVar12,auVar20);
  auVar14 = vmulsd_avx512f(auVar11,auVar20);
  dVar2 = ((auVar18._0_8_ * dVar6) / dVar10) * auVar20._0_8_;
  dVar3 = (auVar19._0_8_ / dVar3) * auVar20._0_8_;
  dVar6 = dVar33 * -dVar22;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = dVar22 * dVar25;
  auVar17 = vmulsd_avx512f(auVar37,auVar11);
  auVar11 = vmulsd_avx512f(auVar37,auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = dVar22 * dVar26;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar22;
  auVar12 = vmulsd_avx512f(auVar32,auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar12._0_8_;
  auVar12 = vmulsd_avx512f(auVar32,auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar12._0_8_;
  dVar33 = dVar21 * dVar33;
  dVar7 = dVar27 * -dVar21;
  dVar22 = dVar22 * dVar27;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar7;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = dVar33;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = dVar8;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = auVar13._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = auVar14._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = dVar22;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar6;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = dVar7;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = dVar33;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = dVar23;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = dVar8;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = auVar17._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = auVar13._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = auVar11._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = auVar14._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = dVar22;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = dVar6;
  local_740._0_8_ = local_d28;
  local_740._8_16_ = ZEXT816(0) << 0x20;
  ChMatrix33<double>::Set_A_Rxyz(&local_c08,(ChVector<double> *)local_740);
  local_740._0_8_ = local_cb0;
  local_740._8_16_ = ZEXT816(0) << 0x20;
  ChMatrix33<double>::Set_A_Rxyz(&local_c50,(ChVector<double> *)local_740);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740);
  local_ba8.m_value = 0;
  vStack_ba0.m_value = 0;
  local_b98 = 0xc;
  local_bc0._0_8_ = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  local_bb0 = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)local_bc0,
             &local_c08.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_bc0._0_8_ = local_608;
  local_ba8.m_value = 3;
  vStack_ba0.m_value = 3;
  local_b98 = 0xc;
  local_bb0 = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)local_bc0,
             &local_c08.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_bc0._0_8_ = local_608 + 0x138;
  local_ba8.m_value = 6;
  vStack_ba0.m_value = 6;
  local_b98 = 0xc;
  local_bb0 = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)local_bc0,
             &local_c50.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_bc0._0_8_ = local_398;
  local_ba8.m_value = 9;
  vStack_ba0.m_value = 9;
  local_b98 = 0xc;
  local_bb0 = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_3,_3,_false> *)local_bc0,
             &local_c50.super_Matrix<double,_3,_3,_1,_3,_3>);
  local_bc0._0_8_ = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  local_bc0._8_8_ = M;
  local_bb0 = (DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_740;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,0>>
            (M,(Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
                *)local_bc0);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run(&local_1a0);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4].
  _0_4_ = (undefined4)local_d00;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[4].
  _4_4_ = local_d00._4_4_;
  auVar14._0_8_ = -local_cf0;
  auVar14._8_4_ = (undefined4)uStack_ce8;
  auVar14._12_4_ = uStack_ce8._4_4_ ^ 0x80000000;
  auVar11._0_8_ = -local_d00;
  auVar11._8_4_ = (undefined4)uStack_cf8;
  auVar11._12_4_ = uStack_cf8._4_4_ ^ 0x80000000;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[5] =
       (double)vmovlps_avx(auVar14);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[9] =
       (double)vmovlps_avx(auVar11);
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
  ._0_4_ = (undefined4)local_cf0;
  local_1a0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0xf]
  ._4_4_ = local_cf0._4_4_;
  Eigen::internal::setIdentity_impl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_true>::run
            ((Matrix<double,_6,_6,_1,_6,_6> *)(local_398 + 0xd8));
  local_2a0 = (undefined4)local_d20;
  uStack_29c = local_d20._4_4_;
  auVar17._0_8_ = -local_d10;
  auVar17._8_4_ = (undefined4)uStack_d08;
  auVar17._12_4_ = uStack_d08._4_4_ ^ 0x80000000;
  auVar12._0_8_ = -local_d20;
  auVar12._8_4_ = (undefined4)uStack_d18;
  auVar12._12_4_ = uStack_d18._4_4_ ^ 0x80000000;
  local_298 = vmovlps_avx(auVar17);
  local_278 = vmovlps_avx(auVar12);
  local_248 = (undefined4)local_d10;
  uStack_244 = local_d10._4_4_;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)local_bc0);
  local_c68.m_value = 0;
  vStack_c60.m_value = 0;
  local_c58 = 0xc;
  local_c80._0_8_ =
       (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
        *)local_bc0;
  local_c70 = (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
               *)local_bc0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_c80,&local_1a0);
  local_c80._0_8_ = auStack_950;
  local_c68.m_value = 6;
  vStack_c60.m_value = 6;
  local_c58 = 0xc;
  local_c70 = (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
               *)local_bc0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,1,12,12>,6,6,false>,Eigen::Matrix<double,6,6,1,6,6>>
            ((Block<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_6,_6,_false> *)local_c80,
             (Matrix<double,_6,_6,_1,_6,_6> *)(local_398 + 0xd8));
  local_c80._0_8_ =
       (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
        *)local_bc0;
  local_c80._8_8_ = M;
  local_c70 = (Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
               *)local_bc0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,0>>
            (M,(Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
                *)local_c80);
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix(
    ChMatrixNM<double, 12, 12>& M) {
    M.setZero();
    double mu1 = this->sectionA->GetMassPerUnitLength();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmzz1;
    double Jmyy1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    double Jmxx1 = Jmyy1 + Jmzz1;

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmzz2;
    double Jmyy2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    double Jmxx2 = Jmyy2 + Jmzz2;

    double L = this->GetLength();
    double LL = L * L;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;
    double mu = this->avg_sec_par->mu;
    double Jmxx = this->avg_sec_par->Jmxx;

    // The radii of gyration ry,rz are:
    // double ry = pow(Iyy / A, 0.5);
    // double rz = pow(Izz / A, 0.5);
    // We have: Iyy / A == Iyy * pho / (A * pho) = Jyy / mu
    // For wind turbine blade, the above equations are not true, but can be a good approximation.
    // double ry = pow(Jmyy / mu, 0.5);   // wrong modal results, error up to 5%
    // double rz = pow(Jmzz / mu, 0.5);   // wrong modal results, error up to 5%

    // double ry = pow(EImyy / EA, 0.5);  // run error
    // double rz = pow(EImzz / EA, 0.5);  // run error

    // Note: bending inertia has to be switched off!
    double ry = 0;  // Only this setting could give correct modal results
    double rz = 0;  // But, why? TODO: need an explanation

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double ry_L2 = pow(ry / L, 2.0);
    double rz_L2 = pow(rz / L, 2.0);
    double oneplusphiy2 = pow(1 + phiy, 2.0);
    double oneplusphiz2 = pow(1 + phiz, 2.0);
    double mAz = (13. / 35. + 7. / 10. * phiy + 1. / 3. * phiy2 + 6. / 5. * rz_L2) / oneplusphiy2;
    double mAy = (13. / 35. + 7. / 10. * phiz + 1. / 3. * phiz2 + 6. / 5. * ry_L2) / oneplusphiz2;
    double mBy = (9. / 70. + 3. / 10. * phiy + 1. / 6. * phiy2 - 6. / 5. * rz_L2) / oneplusphiy2;
    double mBz = (9. / 70. + 3. / 10. * phiz + 1. / 6. * phiz2 - 6. / 5. * ry_L2) / oneplusphiz2;
    double mCy =
        (11. / 210. + 11. / 120. * phiy + 1. / 24. * phiy2 + (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mCz =
        (11. / 210. + 11. / 120. * phiz + 1. / 24. * phiz2 + (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mDy =
        (13. / 420. + 3. / 40. * phiy + 1. / 24. * phiy2 - (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mDz =
        (13. / 420. + 3. / 40. * phiz + 1. / 24. * phiz2 - (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mEy =
        (1. / 105. + 1. / 60. * phiy + 1. / 120. * phiy2 + (2. / 15. + 1. / 6. * phiy + 1. / 3. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mEz =
        (1. / 105. + 1. / 60. * phiz + 1. / 120. * phiz2 + (2. / 15. + 1. / 6. * phiz + 1. / 3. * phiz2) * ry_L2) * LL /
        oneplusphiz2;
    double mFy =
        (1. / 140. + 1. / 60. * phiy + 1. / 120. * phiy2 + (1. / 30. + 1. / 6. * phiy - 1. / 6. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mFz =
        (1. / 140. + 1. / 60. * phiz + 1. / 120. * phiz2 + (1. / 30. + 1. / 6. * phiz - 1. / 6. * phiz2) * ry_L2) * LL /
        oneplusphiz2;

    double mt1 = mu1 * L;
    double mt2 = mu2 * L;
    double mt = mu * L;

    M(0, 0) = mt1 / 3.0;
    M(6, 6) = mt2 / 3.0;
    M(6, 0) = mt / 6.0;
    M(0, 6) = M(6, 0);

    M(3, 3) = Jmxx1 * L / 3.0;
    M(9, 9) = Jmxx2 * L / 3.0;
    M(9, 3) = Jmxx * L / 6.0;
    M(3, 9) = M(9, 3);

    M(1, 1) = mt1 * mAz;
    M(2, 2) = mt1 * mAy;
    M(4, 4) = mt1 * mEy;
    M(5, 5) = mt1 * mEz;
    M(7, 7) = mt2 * mAz;
    M(8, 8) = mt2 * mAy;
    M(10, 10) = mt2 * mEy;
    M(11, 11) = mt2 * mEz;

    M(4, 2) = -mt1 * mCy;
    M(5, 1) = mt1 * mCz;
    M(7, 1) = mt * mBz;
    M(8, 2) = mt * mBy;
    M(7, 5) = mt * mDz;
    M(8, 4) = -mt * mDy;
    M(10, 2) = mt * mDy;
    M(11, 1) = -mt * mDz;
    M(10, 4) = -mt * mFy;
    M(11, 5) = -mt * mFz;
    M(10, 8) = mt2 * mCy;
    M(11, 7) = -mt2 * mCz;

    M(2, 4) = M(4, 2);
    M(1, 5) = M(5, 1);
    M(1, 7) = M(7, 1);
    M(2, 8) = M(8, 2);
    M(5, 7) = M(7, 5);
    M(4, 8) = M(8, 4);
    M(2, 10) = M(10, 2);
    M(1, 11) = M(11, 1);
    M(4, 10) = M(10, 4);
    M(5, 11) = M(11, 5);
    M(8, 10) = M(10, 8);
    M(7, 11) = M(11, 7);

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(mass_phi1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(mass_phi2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;
    M = Rotsect.transpose() * M * Rotsect;

    // transformation matrix for section A
    ChMatrixNM<double, 6, 6> Tm1;
    Tm1.setIdentity();
    Tm1(0, 4) = Mz1;
    Tm1(0, 5) = -My1;
    Tm1(1, 3) = -Mz1;
    Tm1(2, 3) = My1;

    // transformation matrix for section B
    ChMatrixNM<double, 6, 6> Tm2;
    Tm2.setIdentity();
    Tm2(0, 4) = Mz2;
    Tm2(0, 5) = -My2;
    Tm2(1, 3) = -Mz2;
    Tm2(2, 3) = My2;

    // whole transformation matrix
    ChMatrixNM<double, 12, 12> Tm;
    Tm.setZero();
    Tm.block<6, 6>(0, 0) = Tm1;
    Tm.block<6, 6>(6, 6) = Tm2;

    // do the transformation for mass matrix
    M = Tm.transpose() * M * Tm;
}